

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  long lVar5;
  ostream *poVar6;
  ulonglong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  string sStack_380;
  undefined1 *puStack_360;
  undefined8 uStack_358;
  undefined1 auStack_350 [16];
  string sStack_340;
  FILE *pFStack_320;
  string sStack_318;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> _Stack_2f8;
  string sStack_2e0;
  string sStack_2c0;
  string sStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_280;
  string sStack_260;
  string sStack_240;
  string sStack_220;
  string sStack_200;
  string sStack_1e0;
  string sStack_1c0;
  string sStack_1a0;
  string sStack_180;
  string sStack_160;
  string sStack_140;
  string sStack_120;
  string sStack_100;
  string sStack_e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_90;
  string sStack_70;
  string sStack_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_360 = auStack_350;
  uStack_358 = 0;
  auStack_350[0] = 0;
  __stream = fopen("/proc/cpuinfo","r");
  pFStack_320 = __stream;
  if (__stream == (FILE *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_00308044;
  }
  while (iVar3 = feof(__stream), iVar3 == 0) {
    fgetc(__stream);
    std::__cxx11::string::push_back((char)&puStack_360);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&puStack_360);
  while (lVar5 = std::__cxx11::string::find((char *)&puStack_360,0x4423d3), lVar5 != -1) {
    this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
  }
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_c0._M_impl.super__Rb_tree_header._M_header;
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&sStack_e0,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_2a0,this,&sStack_e0,"physical id",0);
  std::__cxx11::string::~string((string *)&sStack_e0);
  while (this->CurrentPositionInFile != 0xffffffffffffffff) {
    sStack_2e0._M_dataplus._M_p._0_4_ = atoi(sStack_2a0._M_dataplus._M_p);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &_Stack_c0,(int *)&sStack_2e0);
    std::__cxx11::string::string((string *)&sStack_50,(string *)&puStack_360);
    ExtractValueFromCpuInfoFile
              (&sStack_2c0,this,&sStack_50,"physical id",this->CurrentPositionInFile + 1);
    std::__cxx11::string::operator=((string *)&sStack_2a0,(string *)&sStack_2c0);
    std::__cxx11::string::~string((string *)&sStack_2c0);
    std::__cxx11::string::~string((string *)&sStack_50);
  }
  bVar10 = _Stack_c0._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar3 = (int)_Stack_c0._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string((string *)&sStack_100,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_2c0,this,&sStack_100,"cpu cores",0);
  std::__cxx11::string::~string((string *)&sStack_100);
  iVar4 = atoi(sStack_2c0._M_dataplus._M_p);
  iVar3 = (iVar3 + (uint)bVar10) * (iVar4 + (uint)(iVar4 == 0));
  uVar8 = iVar3 + (uint)(iVar3 == 0);
  this->NumberOfPhysicalCPU = uVar8;
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical = this->NumberOfLogicalCPU / uVar8;
  std::__cxx11::string::string((string *)&sStack_120,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_2e0,this,&sStack_120,"cpu MHz",0);
  std::__cxx11::string::~string((string *)&sStack_120);
  if (sStack_2e0._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_140,(string *)&puStack_360);
    ExtractValueFromCpuInfoFile(&sStack_318,this,&sStack_140,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_2e0,(string *)&sStack_318);
    std::__cxx11::string::~string((string *)&sStack_318);
    std::__cxx11::string::~string((string *)&sStack_140);
    uVar7 = strtoull((char *)CONCAT44(sStack_2e0._M_dataplus._M_p._4_4_,
                                      (int)sStack_2e0._M_dataplus._M_p),(char **)0x0,0x10);
    fVar11 = (float)uVar7 / 1e+06;
  }
  else {
    dVar2 = atof((char *)CONCAT44(sStack_2e0._M_dataplus._M_p._4_4_,(int)sStack_2e0._M_dataplus._M_p
                                 ));
    fVar11 = (float)dVar2;
  }
  this->CPUSpeedInMHz = fVar11;
  std::__cxx11::string::string((string *)&sStack_160,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_318,this,&sStack_160,"cpu family",0);
  std::__cxx11::string::~string((string *)&sStack_160);
  if (sStack_318._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_180,(string *)&puStack_360);
    ExtractValueFromCpuInfoFile(&sStack_340,this,&sStack_180,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_318,(string *)&sStack_340);
    std::__cxx11::string::~string((string *)&sStack_340);
    std::__cxx11::string::~string((string *)&sStack_180);
  }
  iVar3 = atoi(sStack_318._M_dataplus._M_p);
  (this->ChipID).Family = iVar3;
  std::__cxx11::string::string((string *)&sStack_1a0,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_340,this,&sStack_1a0,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&sStack_340);
  std::__cxx11::string::~string((string *)&sStack_340);
  std::__cxx11::string::~string((string *)&sStack_1a0);
  FindManufacturer(this,&sStack_318);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    bVar10 = std::operator==(&sStack_318,"PA-RISC 1.1a");
    iVar3 = 0x11a;
    if (!bVar10) {
      bVar10 = std::operator==(&sStack_318,"PA-RISC 2.0");
      iVar3 = 0x200;
      if (!bVar10) goto LAB_00307ae3;
    }
    (this->ChipID).Family = iVar3;
  }
LAB_00307ae3:
  std::__cxx11::string::string((string *)&sStack_1c0,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_340,this,&sStack_1c0,"model",0);
  iVar3 = atoi(sStack_340._M_dataplus._M_p);
  (this->ChipID).Model = iVar3;
  std::__cxx11::string::~string((string *)&sStack_340);
  std::__cxx11::string::~string((string *)&sStack_1c0);
  bVar10 = RetrieveClassicalCPUIdentity(this);
  if (!bVar10) {
    std::__cxx11::string::string((string *)&sStack_1e0,(string *)&puStack_360);
    ExtractValueFromCpuInfoFile(&sStack_340,this,&sStack_1e0,"cpu",0);
    std::__cxx11::string::~string((string *)&sStack_1e0);
    if (sStack_340._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    std::__cxx11::string::~string((string *)&sStack_340);
  }
  std::__cxx11::string::string((string *)&sStack_200,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_340,this,&sStack_200,"stepping",0);
  std::__cxx11::string::~string((string *)&sStack_200);
  if (sStack_340._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_220,(string *)&puStack_360);
    ExtractValueFromCpuInfoFile(&sStack_380,this,&sStack_220,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_340,(string *)&sStack_380);
    std::__cxx11::string::~string((string *)&sStack_380);
    std::__cxx11::string::~string((string *)&sStack_220);
  }
  iVar3 = atoi(sStack_340._M_dataplus._M_p);
  (this->ChipID).Revision = iVar3;
  std::__cxx11::string::string((string *)&sStack_240,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_380,this,&sStack_240,"model name",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).ModelName,(string *)&sStack_380);
  std::__cxx11::string::~string((string *)&sStack_380);
  std::__cxx11::string::~string((string *)&sStack_240);
  _Stack_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sStack_380._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_2f8,(char **)&sStack_380);
  sStack_380._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_2f8,(char **)&sStack_380);
  sStack_380._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_2f8,(char **)&sStack_380);
  (this->Features).L1CacheSize = 0;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)_Stack_2f8._M_impl.super__Vector_impl_data._M_finish -
                      (long)_Stack_2f8._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar9 = uVar9 + 1) {
    std::__cxx11::string::string((string *)&sStack_70,(string *)&puStack_360);
    ExtractValueFromCpuInfoFile
              (&sStack_380,this,&sStack_70,
               _Stack_2f8._M_impl.super__Vector_impl_data._M_start[uVar9],0);
    std::__cxx11::string::~string((string *)&sStack_70);
    if (sStack_380._M_string_length != 0) {
      lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x442486);
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)&bStack_90,(ulong)&sStack_380);
        std::__cxx11::string::operator=((string *)&sStack_380,(string *)&bStack_90);
        std::__cxx11::string::~string((string *)&bStack_90);
      }
      iVar3 = atoi(sStack_380._M_dataplus._M_p);
      piVar1 = &(this->Features).L1CacheSize;
      *piVar1 = *piVar1 + iVar3;
    }
    std::__cxx11::string::~string((string *)&sStack_380);
  }
  std::__cxx11::string::string((string *)&sStack_260,(string *)&puStack_360);
  ExtractValueFromCpuInfoFile(&sStack_380,this,&sStack_260,"flags",0);
  std::__cxx11::string::~string((string *)&sStack_260);
  if (sStack_340._M_string_length != 0) {
    std::operator+(&bStack_280," ",&sStack_380);
    std::operator+(&bStack_90,&bStack_280," ");
    std::__cxx11::string::operator=((string *)&sStack_380,(string *)&bStack_90);
    std::__cxx11::string::~string((string *)&bStack_90);
    std::__cxx11::string::~string((string *)&bStack_280);
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x44248a);
    if (lVar5 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x442490);
    if (lVar5 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x442496);
    if (lVar5 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x44249c);
    if (lVar5 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x4424a2);
    if (lVar5 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x4424a9);
    if (lVar5 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x4424b0);
    if (lVar5 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x4424b7);
    if (lVar5 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x4424be);
    if (lVar5 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&sStack_380,0x4424c5);
    if (lVar5 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  std::__cxx11::string::~string((string *)&sStack_380);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&_Stack_2f8);
  std::__cxx11::string::~string((string *)&sStack_340);
  std::__cxx11::string::~string((string *)&sStack_318);
  std::__cxx11::string::~string((string *)&sStack_2e0);
  std::__cxx11::string::~string((string *)&sStack_2c0);
  std::__cxx11::string::~string((string *)&sStack_2a0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_c0);
LAB_00308044:
  std::__cxx11::string::~string((string *)&puStack_360);
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef _WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID) {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
  }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed()) {
    RetrieveClassicalCPUClockSpeed();
  }

  if (supportsCPUID) {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails()) {
      RetrieveClassicalCPUCacheDetails();
    }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity()) {
      RetrieveClassicalCPUIdentity();
    }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
  }

  this->CPUCountWindows();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetreiveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}